

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_mp_print(void)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *__stream;
  char *__s2;
  char *buf;
  bool local_215;
  bool local_214;
  bool local_213;
  bool local_212;
  bool local_211;
  int local_20c;
  int exp_str_rest;
  int i;
  char *exp_str_wptr;
  char *buff_wptr;
  char *decoded;
  char *exp_str;
  char *mp_buff;
  int exp_str_sz;
  int mp_buff_sz;
  int rc;
  int rsize;
  int fsize_1;
  FILE *tmpf;
  char local_1b8 [4];
  int fsize;
  char result [256];
  int esize;
  char *expected;
  char bin [22];
  char *d;
  char msgpack [128];
  
  _plan(0xc,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_print");
  unique0x00004780 = &d;
  register0x00000000 = (char **)mp_encode_array((char *)unique0x00004780,8);
  register0x00000000 = (char **)mp_encode_int((char *)register0x00000000,-5);
  register0x00000000 = (char **)mp_encode_uint((char *)register0x00000000,0x2a);
  register0x00000000 = (char **)mp_encode_str((char *)register0x00000000,"kill/bill",9);
  register0x00000000 = (char **)mp_encode_array((char *)register0x00000000,0);
  register0x00000000 = (char **)mp_encode_map((char *)register0x00000000,6);
  register0x00000000 = (char **)mp_encode_str((char *)register0x00000000,"bool true",9);
  register0x00000000 = (char **)mp_encode_bool((char *)register0x00000000,true);
  register0x00000000 = (char **)mp_encode_str((char *)register0x00000000,"bool false",10);
  register0x00000000 = (char **)mp_encode_bool((char *)register0x00000000,false);
  register0x00000000 = (char **)mp_encode_str((char *)register0x00000000,"null",4);
  register0x00000000 = (char **)mp_encode_nil((char *)register0x00000000);
  register0x00000000 = (char **)mp_encode_str((char *)register0x00000000,"float",5);
  register0x00000000 = (char **)mp_encode_float((char *)register0x00000000,3.14);
  register0x00000000 = (char **)mp_encode_str((char *)register0x00000000,"double",6);
  register0x00000000 = (char **)mp_encode_double((char *)register0x00000000,3.14);
  register0x00000000 = (char **)mp_encode_uint((char *)register0x00000000,100);
  register0x00000000 = (char **)mp_encode_uint((char *)register0x00000000,500);
  pcVar4 = mp_encode_extl((char *)register0x00000000,'{',3);
  pcVar4[0] = 's';
  pcVar4[1] = 't';
  pcVar4[2] = 'r';
  register0x00000000 = (char **)(pcVar4 + 3);
  expected = (char *)0x908347473657412;
  builtin_strncpy(bin,"\n\"bla\\-bla\"\f\r",0xe);
  register0x00000000 = (char **)mp_encode_bin((char *)register0x00000000,(char *)&expected,0x16);
  register0x00000000 = (char **)mp_encode_map((char *)register0x00000000,0);
  if (msgpack + 0x78 < register0x00000000) {
    __assert_fail("d <= msgpack + sizeof(msgpack)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                  ,0x4ab,"int test_mp_print()");
  }
  sVar5 = strlen(
                "[-5, 42, \"kill/bill\", [], {\"bool true\": true, \"bool false\": false, \"null\": null, \"float\": 3.14, \"double\": 3.14, 100: 500}, (extension: type 123, len 3), \"\\u0012test4\\b\\t\\n\\\"bla\\\\-bla\\\"\\f\\r\\u0000\", {}]"
                );
  result._252_4_ = (undefined4)sVar5;
  iVar1 = mp_snprint(local_1b8,0x100,(char *)&d);
  _ok((uint)(iVar1 == result._252_4_),"fsize == esize",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4b8,
      "mp_snprint return value");
  iVar1 = strcmp(local_1b8,
                 "[-5, 42, \"kill/bill\", [], {\"bool true\": true, \"bool false\": false, \"null\": null, \"float\": 3.14, \"double\": 3.14, 100: 500}, (extension: type 123, len 3), \"\\u0012test4\\b\\t\\n\\\"bla\\\\-bla\\\"\\f\\r\\u0000\", {}]"
                );
  _ok((uint)(iVar1 == 0),"strcmp(result, expected) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4b9,
      "mp_snprint result");
  iVar1 = mp_snprint((char *)0x0,0,(char *)&d);
  _ok((uint)(iVar1 == result._252_4_),"fsize == esize",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4bc,
      "mp_snprint limit = 0");
  iVar1 = mp_snprint(local_1b8,1,(char *)&d);
  local_211 = iVar1 == result._252_4_ && local_1b8[0] == '\0';
  _ok((uint)local_211,"fsize == esize && result[0] == \'\\0\'",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4bf,
      "mp_snprint limit = 1");
  iVar1 = mp_snprint(local_1b8,2,(char *)&d);
  local_212 = iVar1 == result._252_4_ && local_1b8[1] == '\0';
  _ok((uint)local_212,"fsize == esize && result[1] == \'\\0\'",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4c2,
      "mp_snprint limit = 2");
  iVar1 = mp_snprint(local_1b8,result._252_4_,(char *)&d);
  local_213 = false;
  if (iVar1 == result._252_4_) {
    local_213 = local_1b8[result._252_4_ + -1] == '\0';
  }
  _ok((uint)local_213,"fsize == esize && result[esize - 1] == \'\\0\'",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4c6,
      "mp_snprint limit = expected");
  iVar1 = mp_snprint(local_1b8,result._252_4_ + 1,(char *)&d);
  local_214 = false;
  if (iVar1 == result._252_4_) {
    local_214 = local_1b8[(int)result._252_4_] == '\0';
  }
  _ok((uint)local_214,"fsize == esize && result[esize] == \'\\0\'",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4ca,
      "mp_snprint limit = expected + 1");
  __stream = tmpfile();
  if (__stream != (FILE *)0x0) {
    iVar1 = mp_fprint((FILE *)__stream,(char *)&d);
    _ok((uint)(iVar1 == result._252_4_),"fsize == esize",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x4cf,"mp_fprint return value");
    rewind(__stream);
    sVar5 = fread(local_1b8,1,0x100,__stream);
    local_215 = false;
    if ((int)sVar5 == result._252_4_) {
      iVar1 = memcmp(local_1b8,
                     "[-5, 42, \"kill/bill\", [], {\"bool true\": true, \"bool false\": false, \"null\": null, \"float\": 3.14, \"double\": 3.14, 100: 500}, (extension: type 123, len 3), \"\\u0012test4\\b\\t\\n\\\"bla\\\\-bla\\\"\\f\\r\\u0000\", {}]"
                     ,(long)(int)result._252_4_);
      local_215 = iVar1 == 0;
    }
    _ok((uint)local_215,"rsize == esize && memcmp(result, expected, esize) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x4d3,"mp_fprint result");
    fclose(__stream);
  }
  iVar1 = mp_fprint(_stdin,(char *)&d);
  _ok((uint)(iVar1 == -1),"rc == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x4d9,
      "mp_fprint I/O error");
  uVar2 = mp_sizeof_array(1);
  uVar3 = mp_sizeof_uint(1);
  pcVar4 = (char *)malloc((long)(int)(uVar2 * 0x21 + uVar3));
  __s2 = (char *)malloc(0x46);
  buf = (char *)malloc(0x46);
  local_20c = 0;
  _exp_str_rest = __s2;
  exp_str_wptr = pcVar4;
  while( true ) {
    if (0x42 < local_20c) {
      if (_exp_str_rest + 1 == __s2 + 0x46) {
        iVar1 = mp_snprint(buf,0x46,pcVar4);
        _ok((uint)(iVar1 == 0x45),"rc == exp_str_sz - 1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x4f4,"mp_snprint max nesting depth return value");
        iVar1 = strcmp(buf,__s2);
        _ok((uint)(iVar1 == 0),"strcmp(decoded, exp_str) == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x4f5,"mp_snprint max nesting depth result");
        free(buf);
        free(__s2);
        free(pcVar4);
        _space(_stdout);
        printf("# *** %s: done ***\n","test_mp_print");
        iVar1 = check_plan();
        return iVar1;
      }
      __assert_fail("exp_str_wptr + 1 == exp_str + exp_str_sz",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                    ,0x4f2,"int test_mp_print()");
    }
    iVar1 = 0x46 - ((int)_exp_str_rest - (int)__s2);
    if (iVar1 < 1) break;
    if (local_20c < 0x21) {
      exp_str_wptr = mp_encode_array(exp_str_wptr,1);
      exp_str_sz = snprintf(_exp_str_rest,(long)iVar1,"[");
    }
    else if (local_20c == 0x21) {
      exp_str_wptr = mp_encode_uint(exp_str_wptr,1);
      exp_str_sz = snprintf(_exp_str_rest,(long)iVar1,"...");
    }
    else {
      exp_str_sz = snprintf(_exp_str_rest,(long)iVar1,"]");
    }
    _exp_str_rest = _exp_str_rest + exp_str_sz;
    local_20c = local_20c + 1;
  }
  __assert_fail("exp_str_rest > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,0x4e6,"int test_mp_print()");
}

Assistant:

int
test_mp_print()
{
	plan(12);
	header();

	char msgpack[128];
	char *d = msgpack;
	d = mp_encode_array(d, 8);
	d = mp_encode_int(d, -5);
	d = mp_encode_uint(d, 42);
	d = mp_encode_str(d, "kill/bill", 9);
	d = mp_encode_array(d, 0);
	d = mp_encode_map(d, 6);
	d = mp_encode_str(d, "bool true", 9);
	d = mp_encode_bool(d, true);
	d = mp_encode_str(d, "bool false", 10);
	d = mp_encode_bool(d, false);
	d = mp_encode_str(d, "null", 4);
	d = mp_encode_nil(d);
	d = mp_encode_str(d, "float", 5);
	d = mp_encode_float(d, 3.14);
	d = mp_encode_str(d, "double", 6);
	d = mp_encode_double(d, 3.14);
	d = mp_encode_uint(d, 100);
	d = mp_encode_uint(d, 500);
	/* MP_EXT with type 123 and of size 3 bytes. */
	d = mp_encode_extl(d, 123, 3);
	memcpy(d, "str", 3);
	d += 3;
	char bin[] = "\x12test\x34\b\t\n\"bla\\-bla\"\f\r";
	d = mp_encode_bin(d, bin, sizeof(bin));
	d = mp_encode_map(d, 0);
	assert(d <= msgpack + sizeof(msgpack));

	const char *expected =
		"[-5, 42, \"kill/bill\", [], "
		"{\"bool true\": true, \"bool false\": false, \"null\": null, "
		"\"float\": 3.14, \"double\": 3.14, 100: 500}, "
		"(extension: type 123, len 3), "
		"\"\\u0012test4\\b\\t\\n\\\"bla\\\\-bla\\\"\\f\\r\\u0000\", {}]";
	int esize = strlen(expected);

	char result[256];

	int fsize = mp_snprint(result, sizeof(result), msgpack);
	ok(fsize == esize, "mp_snprint return value");
	ok(strcmp(result, expected) == 0, "mp_snprint result");

	fsize = mp_snprint(NULL, 0, msgpack);
	ok(fsize == esize, "mp_snprint limit = 0");

	fsize = mp_snprint(result, 1, msgpack);
	ok(fsize == esize && result[0] == '\0', "mp_snprint limit = 1");

	fsize = mp_snprint(result, 2, msgpack);
	ok(fsize == esize && result[1] == '\0', "mp_snprint limit = 2");

	fsize = mp_snprint(result, esize, msgpack);
	ok(fsize == esize && result[esize - 1] == '\0',
	   "mp_snprint limit = expected");

	fsize = mp_snprint(result, esize + 1, msgpack);
	ok(fsize == esize && result[esize] == '\0',
	   "mp_snprint limit = expected + 1");

	FILE *tmpf = tmpfile();
	if (tmpf != NULL) {
		int fsize = mp_fprint(tmpf, msgpack);
		ok(fsize == esize, "mp_fprint return value");
		(void) rewind(tmpf);
		int rsize = fread(result, 1, sizeof(result), tmpf);
		ok(rsize == esize && memcmp(result, expected, esize) == 0,
		   "mp_fprint result");
		fclose(tmpf);
	}

	/* stdin is read-only */
	int rc = mp_fprint(stdin, msgpack);
	is(rc, -1, "mp_fprint I/O error");

	/* Test mp_snprint max nesting depth. */
	int mp_buff_sz = (MP_PRINT_MAX_DEPTH + 1) * mp_sizeof_array(1) +
			 mp_sizeof_uint(1);
	int exp_str_sz = 2 * (MP_PRINT_MAX_DEPTH + 1) + 3 + 1;
	char *mp_buff = (char *)malloc(mp_buff_sz);
	char *exp_str = (char *)malloc(exp_str_sz);
	char *decoded = (char *)malloc(exp_str_sz);
	char *buff_wptr = mp_buff;
	char *exp_str_wptr = exp_str;
	for (int i = 0; i <= 2 * (MP_PRINT_MAX_DEPTH + 1); i++) {
		int exp_str_rest = exp_str_sz - (exp_str_wptr - exp_str);
		assert(exp_str_rest > 0);
		if (i < MP_PRINT_MAX_DEPTH + 1) {
			buff_wptr = mp_encode_array(buff_wptr, 1);
			rc = snprintf(exp_str_wptr, exp_str_rest, "[");
		} else if (i == MP_PRINT_MAX_DEPTH + 1) {
			buff_wptr = mp_encode_uint(buff_wptr, 1);
			rc = snprintf(exp_str_wptr, exp_str_rest, "...");
		} else {
			rc = snprintf(exp_str_wptr, exp_str_rest, "]");
		}
		exp_str_wptr += rc;
	}
	assert(exp_str_wptr + 1 == exp_str + exp_str_sz);
	rc = mp_snprint(decoded, exp_str_sz, mp_buff);
	ok(rc == exp_str_sz - 1, "mp_snprint max nesting depth return value");
	ok(strcmp(decoded, exp_str) == 0, "mp_snprint max nesting depth result");
	free(decoded);
	free(exp_str);
	free(mp_buff);
	footer();
	return check_plan();
}